

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O0

void __thiscall
bubbleJson::BubbleJson::StringifyArray
          (BubbleJson *this,BubbleValue *value,StringifyTypes stringifyType,int tabCount)

{
  bool bVar1;
  reference value_00;
  int local_4c;
  iterator iStack_48;
  int i_1;
  BubbleValue *local_40;
  int local_34;
  iterator iStack_30;
  int i;
  iterator it;
  vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_> *elements;
  int tabCount_local;
  StringifyTypes stringifyType_local;
  BubbleValue *value_local;
  BubbleJson *this_local;
  
  ContextPushChar(this,'[');
  it._M_current = (BubbleValue *)(value->u).array.elements;
  iStack_30 = std::vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>::begin
                        ((vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>
                          *)it._M_current);
  while( true ) {
    if (stringifyType == StringifyType_Beauty) {
      ContextPushChar(this,'\n');
      for (local_34 = 0; local_34 < tabCount + 1; local_34 = local_34 + 1) {
        ContextPushChar(this,'\t');
      }
    }
    value_00 = __gnu_cxx::
               __normal_iterator<bubbleJson::BubbleValue_*,_std::vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>_>
               ::operator*(&stack0xffffffffffffffd0);
    StringifyValue(this,value_00,stringifyType,tabCount + 1);
    local_40 = (BubbleValue *)
               __gnu_cxx::
               __normal_iterator<bubbleJson::BubbleValue_*,_std::vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>_>
               ::operator++(&stack0xffffffffffffffd0,0);
    iStack_48 = std::vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>::end
                          (it._M_current);
    bVar1 = __gnu_cxx::operator==(&stack0xffffffffffffffd0,&stack0xffffffffffffffb8);
    if (bVar1) break;
    ContextPushChar(this,',');
  }
  if (stringifyType == StringifyType_Beauty) {
    ContextPushChar(this,'\n');
    for (local_4c = 0; local_4c < tabCount; local_4c = local_4c + 1) {
      ContextPushChar(this,'\t');
    }
  }
  ContextPushChar(this,']');
  return;
}

Assistant:

void BubbleJson::StringifyArray(BubbleValue *value, StringifyTypes stringifyType, int tabCount)
{
    ContextPushChar('[');

    tabCount++;
    auto elements = value->u.array.elements;
    auto it = elements->begin();
    while (true)
    {
        if(stringifyType == StringifyType_Beauty)
        {
            ContextPushChar('\n');
            for (int i = 0; i < tabCount; ++i) { ContextPushChar('\t'); }
        }
        StringifyValue(&*it, stringifyType, tabCount);//weird
        it++;

        //reach the last one
        if(it == elements->end())
            break;
        else
            ContextPushChar(',');
    }

    tabCount--;
    if (stringifyType == StringifyType_Beauty)
    {
        ContextPushChar('\n');
        for (int i = 0; i < tabCount; ++i) { ContextPushChar('\t'); }
    }
    ContextPushChar(']');
}